

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void xmlHashScanFull(xmlHashTablePtr hash,xmlHashScannerFull scan,void *data)

{
  bool bVar1;
  uint local_5c;
  undefined1 local_58 [4];
  uint i;
  xmlHashEntry old;
  xmlHashEntry *end;
  xmlHashEntry *entry;
  void *data_local;
  xmlHashScannerFull scan_local;
  xmlHashTablePtr hash_local;
  
  if (((hash != (xmlHashTablePtr)0x0) && (hash->size != 0)) && (scan != (xmlHashScannerFull)0x0)) {
    end = hash->table;
    old.payload = hash->table + hash->size;
    while (end->hashValue != 0) {
      end = end + 1;
      if (old.payload <= end) {
        end = hash->table;
      }
    }
    for (local_5c = 0; local_5c < hash->size; local_5c = local_5c + 1) {
      if ((end->hashValue != 0) && (end->payload != (void *)0x0)) {
        do {
          memcpy(local_58,end,0x28);
          (*scan)(end->payload,data,end->key,end->key2,end->key3);
          bVar1 = false;
          if (((end->hashValue != 0) &&
              ((bVar1 = false, end->payload != (void *)0x0 &&
               (bVar1 = true, end->key == (xmlChar *)old._0_8_)))) &&
             (bVar1 = true, end->key2 == old.key)) {
            bVar1 = end->key3 != old.key2;
          }
        } while (bVar1);
      }
      end = end + 1;
      if (old.payload <= end) {
        end = hash->table;
      }
    }
  }
  return;
}

Assistant:

void
xmlHashScanFull(xmlHashTablePtr hash, xmlHashScannerFull scan, void *data) {
    const xmlHashEntry *entry, *end;
    xmlHashEntry old;
    unsigned i;

    if ((hash == NULL) || (hash->size == 0) || (scan == NULL))
        return;

    /*
     * We must handle the case that a scanned entry is removed when executing
     * the callback (xmlCleanSpecialAttr and possibly other places).
     *
     * Find the start of a probe sequence to avoid scanning entries twice if
     * a deletion happens.
     */
    entry = hash->table;
    end = &hash->table[hash->size];
    while (entry->hashValue != 0) {
        if (++entry >= end)
            entry = hash->table;
    }

    for (i = 0; i < hash->size; i++) {
        if ((entry->hashValue != 0) && (entry->payload != NULL)) {
            /*
             * Make sure to rescan after a possible deletion.
             */
            do {
                old = *entry;
                scan(entry->payload, data, entry->key, entry->key2, entry->key3);
            } while ((entry->hashValue != 0) &&
                     (entry->payload != NULL) &&
                     ((entry->key != old.key) ||
                      (entry->key2 != old.key2) ||
                      (entry->key3 != old.key3)));
        }
        if (++entry >= end)
            entry = hash->table;
    }
}